

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_b(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  target_ulong dest;
  
  ctx->exception = 0x201;
  uVar1 = ctx->opcode;
  dest = (long)((ulong)(uVar1 & 0x3fffffc) << 0x26) >> 0x26;
  if ((uVar1 & 2) == 0) {
    dest = (dest + (ctx->base).pc_next) - 4;
  }
  if ((uVar1 & 1) != 0) {
    gen_setlr(ctx,(ctx->base).pc_next);
  }
  gen_update_cfar(ctx,(ctx->base).pc_next - 4);
  gen_goto_tb(ctx,0,dest);
  return;
}

Assistant:

static void gen_b(DisasContext *ctx)
{
    target_ulong li, target;

    ctx->exception = POWERPC_EXCP_BRANCH;
    /* sign extend LI */
    li = LI(ctx->opcode);
    li = (li ^ 0x02000000) - 0x02000000;
    if (likely(AA(ctx->opcode) == 0)) {
        target = ctx->base.pc_next + li - 4;
    } else {
        target = li;
    }
    if (LK(ctx->opcode)) {
        gen_setlr(ctx, ctx->base.pc_next);
    }
    gen_update_cfar(ctx, ctx->base.pc_next - 4);
    gen_goto_tb(ctx, 0, target);
}